

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

void __thiscall CScriptWitness::SetNull(CScriptWitness *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::clear(&this->stack);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::_M_shrink_to_fit(&this->stack);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetNull() { stack.clear(); stack.shrink_to_fit(); }